

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O0

DreamDomain *
TasDREAM::hypercube(DreamDomain *__return_storage_ptr__,
                   vector<double,_std::allocator<double>_> *lower,
                   vector<double,_std::allocator<double>_> *upper)

{
  anon_class_48_2_17957889 local_50;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *upper_local;
  vector<double,_std::allocator<double>_> *lower_local;
  
  local_20 = upper;
  upper_local = lower;
  lower_local = (vector<double,_std::allocator<double>_> *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector(&local_50.lower,lower);
  std::vector<double,_std::allocator<double>_>::vector(&local_50.upper,local_20);
  std::function<bool(std::vector<double,std::allocator<double>>const&)>::
  function<TasDREAM::hypercube(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&)::_lambda(std::vector<double,std::allocator<double>>const&)_1_,void>
            ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
             __return_storage_ptr__,&local_50);
  hypercube(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&)
  ::{lambda(std::vector<double,std::allocator<double>>const&)#1}::~vector
            ((_lambda_std__vector<double,std::allocator<double>>const___1_ *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline DreamDomain hypercube(std::vector<double> const &lower, std::vector<double> const &upper){
    return [=](const std::vector<double> &x)->bool{
        auto il = lower.begin(), iu = upper.begin();
        for(auto v : x) if ((v < *il++) || (v > *iu++)) return false;
        return true;
    };
}